

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuThreadUtil.cpp
# Opt level: O2

int __thiscall tcu::ThreadUtil::Thread::getMessageCount(Thread *this)

{
  pointer pMVar1;
  pointer pMVar2;
  
  de::Mutex::lock(&this->m_messageLock);
  pMVar1 = (this->m_messages).
           super__Vector_base<tcu::ThreadUtil::Message,_std::allocator<tcu::ThreadUtil::Message>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  pMVar2 = (this->m_messages).
           super__Vector_base<tcu::ThreadUtil::Message,_std::allocator<tcu::ThreadUtil::Message>_>.
           _M_impl.super__Vector_impl_data._M_start;
  de::Mutex::unlock(&this->m_messageLock);
  return (int)(((long)pMVar1 - (long)pMVar2) / 0x28);
}

Assistant:

int Thread::getMessageCount	 (void) const
{
	de::ScopedLock lock(m_messageLock);
	return (int)(m_messages.size());
}